

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableLayout.cpp
# Opt level: O3

QSize __thiscall KDReports::TableLayout::decorationSize(TableLayout *this,QVariant *cellDecoration)

{
  bool bVar1;
  char cVar2;
  QMetaType QVar3;
  QSize QVar4;
  QImage *pQVar5;
  PrivateShared *pPVar6;
  QPixmap pix;
  QImage img;
  QMetaType in_stack_ffffffffffffffb8;
  QMetaType in_stack_ffffffffffffffc0;
  QImage local_28 [24];
  
  bVar1 = operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    pQVar5 = (QImage *)cellDecoration;
    if (((cellDecoration->d).field_0x18 & 1) != 0) {
      pPVar6 = (cellDecoration->d).data.shared;
      pQVar5 = (QImage *)(pPVar6 + *(int *)(pPVar6 + 4));
    }
    QImage::QImage(local_28,pQVar5);
  }
  else {
    QImage::QImage(local_28);
    QVar3.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    pPVar6 = (PrivateShared *)cellDecoration;
    if (((cellDecoration->d).field_0x18 & 1) != 0) {
      pPVar6 = (cellDecoration->d).data.shared;
      pPVar6 = pPVar6 + *(int *)(pPVar6 + 4);
    }
    QMetaType::convert(QVar3,pPVar6,(QMetaType)0x175f30,local_28);
  }
  cVar2 = QImage::isNull();
  if (cVar2 == '\0') {
    QVar4 = (QSize)QImage::size();
  }
  else {
    bVar1 = operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (bVar1) {
      if (((cellDecoration->d).field_0x18 & 1) != 0) {
        pPVar6 = (cellDecoration->d).data.shared;
        cellDecoration = (QVariant *)(pPVar6 + *(int *)(pPVar6 + 4));
      }
      QPixmap::QPixmap((QPixmap *)&stack0xffffffffffffffc0,(QPixmap *)cellDecoration);
    }
    else {
      QPixmap::QPixmap((QPixmap *)&stack0xffffffffffffffc0);
      QVar3.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((cellDecoration->d).field_0x18 & 1) != 0) {
        pPVar6 = (cellDecoration->d).data.shared;
        cellDecoration = (QVariant *)(pPVar6 + *(int *)(pPVar6 + 4));
      }
      QMetaType::convert(QVar3,cellDecoration,(QMetaType)0x176010,&stack0xffffffffffffffc0);
    }
    cVar2 = QPixmap::isNull();
    if (cVar2 == '\0') {
      QVar4 = (QSize)QPixmap::size();
    }
    else {
      QVar4 = this->m_iconSize;
    }
    QPixmap::~QPixmap((QPixmap *)&stack0xffffffffffffffc0);
  }
  QImage::~QImage(local_28);
  return QVar4;
}

Assistant:

QSize KDReports::TableLayout::decorationSize(const QVariant &cellDecoration) const
{
    QImage img = qvariant_cast<QImage>(cellDecoration);
    if (!img.isNull()) {
        return img.size();
    }
    QPixmap pix = qvariant_cast<QPixmap>(cellDecoration);
    if (!pix.isNull()) {
        return pix.size();
    }
    return m_iconSize;
}